

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultStack.cpp
# Opt level: O0

void __thiscall DefaultStack::DefaultStack(DefaultStack *this)

{
  DefaultStack *this_local;
  
  ProtocolMACEthernet::ProtocolMACEthernet(&this->MAC,&this->ARP,&this->IP);
  ProtocolIPv4::ProtocolIPv4
            (&this->IP,(InterfaceMAC *)this,&this->ARP,&this->ICMP,&this->TCP,&this->UDP);
  ProtocolARP::ProtocolARP(&this->ARP,(InterfaceMAC *)this,&this->IP);
  ProtocolDHCP::ProtocolDHCP(&this->DHCP,(InterfaceMAC *)this,&this->IP,&this->UDP);
  ProtocolICMP::ProtocolICMP(&this->ICMP,&this->IP);
  ProtocolTCP::ProtocolTCP(&this->TCP,&this->IP);
  ProtocolUDP::ProtocolUDP(&this->UDP,&this->IP,&this->DHCP);
  return;
}

Assistant:

DefaultStack::DefaultStack()
    : MAC(ARP, IP)
    , IP(MAC, ARP, ICMP, TCP, UDP)
    , ARP(MAC, IP)
    , DHCP(MAC, IP, UDP)
    , ICMP(IP)
    , TCP(IP)
    , UDP(IP, DHCP)
{
}